

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

SPIRFunction * __thiscall spirv_cross::Variant::get<spirv_cross::SPIRFunction>(Variant *this)

{
  CompilerError *pCVar1;
  Variant *this_local;
  
  if (this->holder == (IVariant *)0x0) {
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar1,"nullptr");
    __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  if (this->type != TypeFunction) {
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar1,"Bad cast");
    __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  return (SPIRFunction *)this->holder;
}

Assistant:

T &get()
	{
		if (!holder)
			SPIRV_CROSS_THROW("nullptr");
		if (static_cast<Types>(T::type) != type)
			SPIRV_CROSS_THROW("Bad cast");
		return *static_cast<T *>(holder);
	}